

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void __thiscall rlist::listDel(rlist *this)

{
  listNode *plVar1;
  
  plVar1 = this->rl->head;
  this->view = plVar1;
  while (plVar1 != (listNode *)0x0) {
    this->view = plVar1->next;
    operator_delete(plVar1);
    plVar1 = this->view;
  }
  return;
}

Assistant:

void rlist::listDel(){
      view=rl->head;
      listNode *tmp=NULL;
      while(view!=NULL){
            tmp=view;
            view=view->next;
            delete tmp;
      }
}